

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

char * qpdf_get_info_key(qpdf_data qpdf,char *key)

{
  bool bVar1;
  char *pcVar2;
  QPDFObjectHandle value;
  QPDFObjectHandle info;
  QPDFObjectHandle trailer;
  allocator<char> local_69;
  string local_68;
  QPDFObjectHandle local_48;
  undefined1 local_38 [16];
  QPDFObjectHandle local_28;
  
  QPDF::getTrailer((QPDF *)(local_38 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"/Info",(allocator<char> *)local_38);
  bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)(local_38 + 0x10),&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"/Info",(allocator<char> *)&local_48);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_38,(string *)(local_38 + 0x10));
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,key,(allocator<char> *)&local_48);
    bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_38,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,key,&local_69);
      QPDFObjectHandle::getKey(&local_48,(string *)local_38);
      std::__cxx11::string::~string((string *)&local_68);
      bVar1 = QPDFObjectHandle::isString(&local_48);
      if (bVar1) {
        QPDFObjectHandle::getStringValue_abi_cxx11_(&local_68,&local_48);
        std::__cxx11::string::operator=((string *)&qpdf->tmp_string,(string *)&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        pcVar2 = (qpdf->tmp_string)._M_dataplus._M_p;
      }
      else {
        pcVar2 = (char *)0x0;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_48.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      pcVar2 = (char *)0x0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  }
  else {
    pcVar2 = (char *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 0x18));
  return pcVar2;
}

Assistant:

char const*
qpdf_get_info_key(qpdf_data qpdf, char const* key)
{
    char const* result = nullptr;
    QPDFObjectHandle trailer = qpdf->qpdf->getTrailer();
    if (trailer.hasKey("/Info")) {
        QPDFObjectHandle info = trailer.getKey("/Info");
        if (info.hasKey(key)) {
            QPDFObjectHandle value = info.getKey(key);
            if (value.isString()) {
                qpdf->tmp_string = value.getStringValue();
                result = qpdf->tmp_string.c_str();
            }
        }
    }
    QTC::TC("qpdf", "qpdf-c get_info_key", (result == nullptr ? 0 : 1));
    return result;
}